

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 float128_mul_mips(float128 a,float128 b,float_status *status)

{
  float128 a_00;
  float128 a_01;
  float128 a_02;
  float128 b_00;
  float128 b_01;
  float128 a_03;
  float128 a_04;
  float128 a_05;
  float128 a_06;
  float128 a_07;
  uint64_t uVar1;
  float128 fVar2;
  uint64_t local_90;
  uint64_t zSig3;
  uint64_t zSig2;
  uint64_t zSig1;
  uint64_t zSig0;
  uint64_t bSig1;
  uint64_t bSig0;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t zExp;
  int32_t bExp;
  int32_t aExp;
  flag zSign;
  flag bSign;
  flag aSign;
  float_status *status_local;
  float128 b_local;
  float128 a_local;
  
  b_local.low = b.high;
  status_local = (float_status *)b.low;
  uVar1 = a.high;
  b_local.high = a.low;
  _aExp = status;
  bSig0 = extractFloat128Frac1(a);
  a_03.high = uVar1;
  a_03.low = b_local.high;
  aSig1 = extractFloat128Frac0(a_03);
  a_04.high = uVar1;
  a_04.low = b_local.high;
  zExp = extractFloat128Exp(a_04);
  a_05.high = uVar1;
  a_05.low = b_local.high;
  bExp._3_1_ = extractFloat128Sign(a_05);
  fVar2.high = b_local.low;
  fVar2.low = (uint64_t)status_local;
  zSig0 = extractFloat128Frac1(fVar2);
  a_00.high = b_local.low;
  a_00.low = (uint64_t)status_local;
  bSig1 = extractFloat128Frac0(a_00);
  a_01.high = b_local.low;
  a_01.low = (uint64_t)status_local;
  aSig0._4_4_ = extractFloat128Exp(a_01);
  a_02.high = b_local.low;
  a_02.low = (uint64_t)status_local;
  bExp._2_1_ = extractFloat128Sign(a_02);
  bExp._1_1_ = bExp._3_1_ ^ bExp._2_1_;
  if (zExp == 0x7fff) {
    if ((aSig1 != 0 || bSig0 != 0) || ((aSig0._4_4_ == 0x7fff && (bSig1 != 0 || zSig0 != 0)))) {
      a_06.high = uVar1;
      a_06.low = b_local.high;
      b_00.high = b_local.low;
      b_00.low = (uint64_t)status_local;
      fVar2 = propagateFloat128NaN(a_06,b_00,_aExp);
      return fVar2;
    }
    if ((aSig0._4_4_ != 0 || bSig1 != 0) || zSig0 != 0) {
      fVar2 = packFloat128(bExp._1_1_,0x7fff,0,0);
      return fVar2;
    }
  }
  else {
    if (aSig0._4_4_ != 0x7fff) {
      if (zExp == 0) {
        if (aSig1 == 0 && bSig0 == 0) {
          fVar2 = packFloat128(bExp._1_1_,0,0,0);
          return fVar2;
        }
        normalizeFloat128Subnormal(aSig1,bSig0,&zExp,&aSig1,&bSig0);
      }
      if (aSig0._4_4_ == 0) {
        if (bSig1 == 0 && zSig0 == 0) {
          fVar2 = packFloat128(bExp._1_1_,0,0,0);
          return fVar2;
        }
        normalizeFloat128Subnormal(bSig1,zSig0,(int32_t *)((long)&aSig0 + 4),&bSig1,&zSig0);
      }
      aSig0._0_4_ = zExp + aSig0._4_4_ + -0x4000;
      aSig1 = aSig1 | 0x1000000000000;
      shortShift128Left(bSig1,zSig0,0x10,&bSig1,&zSig0);
      mul128To256(aSig1,bSig0,bSig1,zSig0,&zSig1,&zSig2,&zSig3,&local_90);
      add128(zSig1,zSig2,aSig1,bSig0,&zSig1,&zSig2);
      zSig3 = (long)(int)(uint)(local_90 != 0) | zSig3;
      if (0x1ffffffffffff < zSig1) {
        shift128ExtraRightJamming(zSig1,zSig2,zSig3,1,&zSig1,&zSig2,&zSig3);
        aSig0._0_4_ = (int)aSig0 + 1;
      }
      fVar2 = roundAndPackFloat128(bExp._1_1_,(int)aSig0,zSig1,zSig2,zSig3,_aExp);
      return fVar2;
    }
    if (bSig1 != 0 || zSig0 != 0) {
      a_07.high = uVar1;
      a_07.low = b_local.high;
      b_01.high = b_local.low;
      b_01.low = (uint64_t)status_local;
      fVar2 = propagateFloat128NaN(a_07,b_01,_aExp);
      return fVar2;
    }
    if ((zExp != 0 || aSig1 != 0) || bSig0 != 0) {
      fVar2 = packFloat128(bExp._1_1_,0x7fff,0,0);
      return fVar2;
    }
  }
  float_raise_mips('\x01',_aExp);
  fVar2 = float128_default_nan_mips(_aExp);
  return fVar2;
}

Assistant:

float128 float128_mul(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2, zSig3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( bExp | bSig0 | bSig1 ) == 0 ) goto invalid;
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    zExp = aExp + bExp - 0x4000;
    aSig0 |= UINT64_C(0x0001000000000000);
    shortShift128Left( bSig0, bSig1, 16, &bSig0, &bSig1 );
    mul128To256( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1, &zSig2, &zSig3 );
    add128( zSig0, zSig1, aSig0, aSig1, &zSig0, &zSig1 );
    zSig2 |= ( zSig3 != 0 );
    if (UINT64_C( 0x0002000000000000) <= zSig0 ) {
        shift128ExtraRightJamming(
            zSig0, zSig1, zSig2, 1, &zSig0, &zSig1, &zSig2 );
        ++zExp;
    }
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}